

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::quadratic_cost_type
          (quadratic_cost_type<double> *this,quadratic_cost_type<double> *other,int n)

{
  int __n;
  pointer __first;
  pointer __result;
  pointer __first_00;
  pointer __result_00;
  pointer __first_01;
  type piVar1;
  pointer __result_01;
  int n_local;
  quadratic_cost_type<double> *other_local;
  quadratic_cost_type<double> *this_local;
  
  this->obj = other->obj;
  std::make_unique<double[]>((size_t)&this->linear_elements);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&other->indices,(long)n);
  std::make_unique<baryonyx::itm::quadratic_cost_type<double>::quad[]>
            ((size_t)&this->quadratic_elements);
  std::make_unique<int[]>((size_t)&this->indices);
  __first = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&other->linear_elements);
  __result = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&this->linear_elements);
  std::copy_n<double*,int,double*>(__first,n,__result);
  __first_00 = std::unique_ptr<int[],_std::default_delete<int[]>_>::get(&other->indices);
  __result_00 = std::unique_ptr<int[],_std::default_delete<int[]>_>::get(&this->indices);
  std::copy_n<int*,int,int*>(__first_00,n + 1,__result_00);
  __first_01 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               ::get(&other->quadratic_elements);
  piVar1 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&other->indices,(long)n);
  __n = *piVar1;
  __result_01 = std::
                unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                ::get(&this->quadratic_elements);
  std::
  copy_n<baryonyx::itm::quadratic_cost_type<double>::quad*,int,baryonyx::itm::quadratic_cost_type<double>::quad*>
            (__first_01,__n,__result_01);
  return;
}

Assistant:

quadratic_cost_type(const quadratic_cost_type& other, int n)
      : obj(other.obj)
      , linear_elements(std::make_unique<Float[]>(n))
      , quadratic_elements(std::make_unique<quad[]>(other.indices[n]))
      , indices(std::make_unique<int[]>(n + 1))
    {
        std::copy_n(other.linear_elements.get(), n, linear_elements.get());
        std::copy_n(other.indices.get(), n + 1, indices.get());
        std::copy_n(other.quadratic_elements.get(),
                    other.indices[n],
                    quadratic_elements.get());
    }